

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringOps.cpp
# Opt level: O3

string * __thiscall
gmlc::utilities::stringOps::getTailString_abi_cxx11_
          (string *__return_storage_ptr__,stringOps *this,string_view input,char sep)

{
  stringOps *psVar1;
  stringOps *psVar2;
  stringOps *psVar3;
  undefined7 in_register_00000081;
  long lVar4;
  long lVar5;
  
  lVar4 = CONCAT71(in_register_00000081,sep);
  psVar3 = (stringOps *)input._M_len;
  if (this == (stringOps *)0x0) {
    this = (stringOps *)0x0;
  }
  else {
    lVar4 = -(long)this;
    psVar2 = (stringOps *)0xffffffffffffffff;
    lVar5 = -1;
    do {
      if (lVar4 + (long)psVar2 == -1) goto LAB_003e2dce;
      psVar2 = psVar2 + 1;
      psVar1 = psVar3 + lVar5;
      lVar5 = lVar5 + -1;
    } while (this[(long)psVar1] != input._M_str._0_1_);
    psVar3 = this + ((long)psVar3 - (long)psVar2);
    this = psVar2;
  }
LAB_003e2dce:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,psVar3,this + (long)psVar3,
             &__return_storage_ptr__->field_2,lVar4);
  return __return_storage_ptr__;
}

Assistant:

std::string getTailString(std::string_view input, char sep) noexcept
    {
        auto sepLoc = input.find_last_of(sep);
        auto ret = std::string(
            (sepLoc == std::string::npos) ? input : input.substr(sepLoc + 1));
        return ret;
    }